

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5f811d::GlobalQualifiedName::printLeft(GlobalQualifiedName *this,OutputStream *S)

{
  char *pcVar1;
  size_t sVar2;
  Node *pNVar3;
  
  OutputStream::grow(S,2);
  pcVar1 = S->Buffer;
  sVar2 = S->CurrentPosition;
  (pcVar1 + sVar2)[0] = ':';
  (pcVar1 + sVar2)[1] = ':';
  S->CurrentPosition = S->CurrentPosition + 2;
  pNVar3 = this->Child;
  (*pNVar3->_vptr_Node[4])(pNVar3,S);
  if (pNVar3->RHSComponentCache == No) {
    return;
  }
  (*pNVar3->_vptr_Node[5])(pNVar3,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "::";
    Child->print(S);
  }